

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall
QTreeModel::dropMimeData
          (QTreeModel *this,QMimeData *data,DropAction action,int row,int column,QModelIndex *parent
          )

{
  byte bVar1;
  QTreeModel *this_00;
  QTreeWidgetItem *pQVar2;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  undefined4 local_18;
  
  local_18 = in_ECX;
  if ((in_ECX == -1) && (in_R8D == -1)) {
    local_18 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_R9);
  }
  this_00 = (QTreeModel *)view((QTreeModel *)0x9116da);
  pQVar2 = item(this_00,(QModelIndex *)0x9116ed);
  bVar1 = (**(code **)(*(long *)this_00 + 800))(this_00,pQVar2,local_18,in_RSI,in_EDX);
  return (bool)(bVar1 & 1);
}

Assistant:

bool QTreeModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                              int row, int column, const QModelIndex &parent)
{
    if (row == -1 && column == -1)
        row = rowCount(parent); // append
    return view()->dropMimeData(item(parent), row, data, action);
}